

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * GetFunctionUpvalue(ExpressionContext *ctx,SynBase *source,VariableData *target)

{
  uint alignment;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  TypeRef *type_00;
  VariableData *this;
  SynIdentifier *this_00;
  VariableData *local_68;
  VariableData *variable;
  TypeRef *pTStack_58;
  uint offset;
  TypeBase *type;
  VariableData **variable_1;
  InplaceStr upvalueName;
  VariableData *target_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  upvalueName.end = (char *)target;
  _variable_1 = GetFunctionVariableUpvalueName(ctx,target);
  type = (TypeBase *)
         SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                   (&ctx->upvalueMap,(InplaceStr *)&variable_1);
  if (type == (TypeBase *)0x0) {
    pTStack_58 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    variable._4_4_ =
         anon_unknown.dwarf_6f1cc::AllocateGlobalVariable
                   (ctx,source,(pTStack_58->super_TypeBase).alignment,
                    (pTStack_58->super_TypeBase).size);
    this = ExpressionContext::get<VariableData>(ctx);
    type_00 = pTStack_58;
    allocator = ctx->allocator;
    scope = ctx->globalScope;
    alignment = (pTStack_58->super_TypeBase).alignment;
    this_00 = ExpressionContext::get<SynIdentifier>(ctx);
    SynIdentifier::SynIdentifier(this_00,_variable_1);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (this,allocator,source,scope,alignment,&type_00->super_TypeBase,this_00,variable._4_4_
               ,uniqueId);
    local_68 = this;
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->variables,&local_68);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->allVariables,&local_68);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->variables,&local_68);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->upvalues,&local_68);
    SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
              (&ctx->upvalueMap,(InplaceStr *)&variable_1,&local_68);
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)ctx_local,source,local_68->type,local_68);
  }
  else {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)ctx_local,source,(TypeBase *)type->_vptr_TypeBase[4],
               (VariableData *)type->_vptr_TypeBase);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* GetFunctionUpvalue(ExpressionContext &ctx, SynBase *source, VariableData *target)
{
	InplaceStr upvalueName = GetFunctionVariableUpvalueName(ctx, target);

	if(VariableData **variable = ctx.upvalueMap.find(upvalueName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}

	TypeBase *type = ctx.GetReferenceType(ctx.typeVoid);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(upvalueName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.upvalues.push_back(variable);
	ctx.upvalueMap.insert(upvalueName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}